

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::~SimpSolver(SimpSolver *this)

{
  SimpSolver *this_local;
  
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_0012dd20;
  VMap<char>::~VMap(&this->eliminated);
  vec<int,_int>::~vec(&this->frozen_vars);
  VMap<char>::~VMap(&this->frozen);
  Queue<unsigned_int>::~Queue(&this->subsumption_queue);
  Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::~Heap(&this->elim_heap);
  LMap<int>::~LMap(&this->n_occ);
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  ::~OccLists(&this->occurs);
  VMap<char>::~VMap(&this->touched);
  vec<unsigned_int,_int>::~vec(&this->elimclauses);
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

SimpSolver::~SimpSolver()
{
}